

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

string * cfd::core::StringUtil::ToLower(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    iVar3 = tolower((int)pcVar1[sVar4]);
    pcVar1[sVar4] = (char)iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringUtil::ToLower(const std::string &str) {
  static auto tolower_func = [](const char &c_value) -> char {
    return static_cast<char>(std::tolower(static_cast<char>(c_value)));
  };

  std::string value = str;
  std::transform(value.begin(), value.end(), value.begin(), tolower_func);
  return value;
}